

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void run<ANSrfold<2u>>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name
                      )

{
  undefined1 auVar1 [16];
  uint uVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  string *name;
  uint *n;
  uint32_t *b;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar12 [64];
  undefined1 extraout_var_03 [56];
  double dec_ns_per_int;
  double decode_IPS;
  type decode_time_ns;
  time_point stop_decode;
  time_point start_decode;
  int i_1;
  size_t decode_time_ns_min;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  double enc_ns_per_int;
  double encode_IPS;
  double BPI;
  type encoding_time_ns;
  time_point stop_encode;
  time_point start_encode;
  int i;
  size_t encoding_time_ns_min;
  size_t encoded_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  type *sigma;
  type_conflict *input_entropy;
  size_t in_stack_fffffffffffffd98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  uint uVar13;
  allocator_type *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdc0;
  type in_stack_fffffffffffffdd0;
  string local_170 [32];
  string local_150 [32];
  double local_130;
  double local_128;
  unsigned_long local_120;
  duration<long,_std::ratio<1L,_1000000000L>_> local_118;
  undefined8 local_110;
  undefined8 local_108;
  int local_fc;
  unsigned_long local_f8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  double local_d0;
  double local_c8;
  double local_c0;
  unsigned_long local_b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  unsigned_long local_90;
  size_t local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  type *local_30;
  type_conflict *local_28;
  pair<double,_unsigned_long> local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar10 = in_ZMM0._8_56_;
  local_8 = in_RDI;
  local_20 = compute_entropy(in_stack_fffffffffffffda0);
  auVar7._0_8_ = local_20.first;
  auVar7._8_56_ = auVar10;
  local_28 = std::get<0ul,double,unsigned_long>((pair<double,_unsigned_long> *)0x1afdf2);
  local_30 = std::get<1ul,double,unsigned_long>((pair<double,_unsigned_long> *)0x1afe07);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1afe3d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1afe69);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1afe97);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1afec3);
  local_90 = std::numeric_limits<unsigned_long>::max();
  for (local_94 = 0; auVar11 = in_ZMM1._0_16_, local_94 < 1; local_94 = local_94 + 1) {
    local_a0 = std::chrono::_V2::system_clock::now();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1aff03);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1aff35);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1aff5f);
    local_88 = ANSrfold<2U>::encode
                         ((uint32_t *)in_stack_fffffffffffffdb0,
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                          (uint8_t *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          (uint8_t *)0x1aff87);
    local_a8 = std::chrono::_V2::system_clock::now();
    in_ZMM1._8_56_ = extraout_var_02;
    in_ZMM1._0_8_ = extraout_XMM1_Qa;
    auVar7._8_56_ = extraout_var;
    auVar7._0_8_ = (double)extraout_XMM0_Qa;
    local_b0.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)in_stack_fffffffffffffda0);
    local_b8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_b0);
    puVar3 = std::min<unsigned_long>(&local_b8,&local_90);
    local_90 = *puVar3;
  }
  auVar1 = vcvtusi2sd_avx512f(auVar7._0_16_,local_88 << 3);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,sVar4);
  local_c0 = auVar1._0_8_ / auVar11._0_8_;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar8._0_8_ = compute_ips(sVar4,local_90);
  auVar8._8_56_ = extraout_var_00;
  auVar1 = vcvtusi2sd_avx512f(auVar8._0_16_,local_90);
  local_c8 = auVar8._0_8_;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,sVar4);
  auVar12 = ZEXT1664(auVar11);
  local_d0 = auVar1._0_8_ / auVar11._0_8_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1b016c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1b0192);
  local_f8[0] = std::numeric_limits<unsigned_long>::max();
  for (local_fc = 0; auVar11 = auVar12._0_16_, local_fc < 1; local_fc = local_fc + 1) {
    local_108 = std::chrono::_V2::system_clock::now();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b01d7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b01fd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_e8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b021e);
    ANSrfold<2U>::decode
              ((uint8_t *)in_stack_fffffffffffffdb0,
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (uint32_t *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(uint8_t *)0x1b023a);
    local_110 = std::chrono::_V2::system_clock::now();
    auVar12._8_56_ = extraout_var_03;
    auVar12._0_8_ = extraout_XMM1_Qa_00;
    in_stack_fffffffffffffdd0 =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffda0);
    local_118.__r = in_stack_fffffffffffffdd0.__r;
    local_120 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_118);
    puVar3 = std::min<unsigned_long>(&local_120,local_f8);
    local_f8[0] = *puVar3;
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar9._0_8_ = compute_ips(sVar4,local_f8[0]);
  auVar9._8_56_ = extraout_var_01;
  auVar1 = vcvtusi2sd_avx512f(auVar9._0_16_,local_f8[0]);
  this = auVar1._0_8_;
  local_128 = auVar9._0_8_;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,sVar4);
  local_130 = (double)this / auVar11._0_8_;
  name = (string *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b0363);
  n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b0375);
  b = (uint32_t *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  ANSrfold<2u>::name_abi_cxx11_();
  REQUIRE_EQUAL((uint32_t *)in_stack_fffffffffffffdd0.__r,b,(size_t)n,name);
  std::__cxx11::string::~string(local_150);
  uVar5 = std::__cxx11::string::c_str();
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  uVar2 = (uint)sVar4;
  uVar13 = (uint)*local_30;
  ANSrfold<2u>::name_abi_cxx11_();
  uVar6 = std::__cxx11::string::c_str();
  printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%2.3f\t\t\n",*local_28,
         local_c0,local_d0,local_130,uVar5,(ulong)uVar2,(ulong)uVar13,uVar6);
  std::__cxx11::string::~string(local_170);
  fflush(_stdout);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (2) decode
    encoded_data.resize(encoded_bytes);
    std::vector<uint32_t> recover(input.size());
    size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_decode = std::chrono::high_resolution_clock::now();
        t_compressor::decode(encoded_data.data(), encoded_data.size(),
            recover.data(), recover.size(), tmp_buf.data());
        auto stop_decode = std::chrono::high_resolution_clock::now();
        auto decode_time_ns = stop_decode - start_decode;
        decode_time_ns_min
            = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
    }
    double decode_IPS = compute_ips(input.size(), decode_time_ns_min);
    double dec_ns_per_int = double(decode_time_ns_min) / double(input.size());

    // (3) verify
    REQUIRE_EQUAL(
        input.data(), recover.data(), input.size(), t_compressor::name());

    // (4) output stats
    printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%"
           "2.3f\t\t\n",
        input_name.c_str(), (uint32_t)input.size(), (uint32_t)sigma,
        t_compressor::name().c_str(), input_entropy, BPI, enc_ns_per_int,
        dec_ns_per_int);
    fflush(stdout);
}